

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

Image * __thiscall
pbrt::RGBFilm::GetImage
          (Image *__return_storage_ptr__,RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Bounds2i *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Image *pIVar7;
  RGBFilm *pRVar8;
  ImageMetadata *pIVar9;
  Allocator alloc;
  Point2i resolution;
  function<void_(pbrt::Bounds2<int>)> *func;
  long *plVar10;
  long lVar11;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Image *image;
  Float local_d4;
  Image *local_d0;
  RGBFilm *local_c8;
  ImageMetadata *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *pcStack_a8;
  code *pcStack_a0;
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  ColorEncodingHandle local_38;
  
  local_d4 = splatScale;
  local_d0 = __return_storage_ptr__;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
        ,0x225,"Converting image to RGB and computing final weighted pixel values");
  }
  bVar1 = this->writeFP16;
  iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar5 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  local_98._0_8_ = auStack_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"R","");
  local_78[0] = local_68;
  local_c0 = metadata;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"G","");
  plVar10 = local_48;
  local_c8 = this;
  local_58[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"B","");
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pIVar7 = local_d0;
  resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar3 - iVar5;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar2 - iVar4;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  Image::Image(local_d0,Float - bVar1,resolution,channels,&local_38,alloc);
  pIVar9 = local_c0;
  pRVar8 = local_c8;
  this_00 = &(local_c8->super_FilmBase).pixelBounds;
  lVar11 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  local_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8 = (undefined8 *)operator_new(0x18);
  *local_b8 = pRVar8;
  local_b8[1] = &local_d4;
  local_b8[2] = pIVar7;
  local_98._0_8_ = &local_b8;
  pcStack_a0 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_manager;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  auStack_88._8_8_ =
       std::
       _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:173:27)>
       ::_M_invoke;
  auStack_88._0_8_ =
       std::
       _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:173:27)>
       ::_M_manager;
  ParallelFor2D((pbrt *)this_00,(Bounds2i *)local_98,func);
  if ((code *)auStack_88._0_8_ != (code *)0x0) {
    (*(code *)auStack_88._0_8_)(local_98,local_98,3);
  }
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,3);
  }
  if ((pIVar9->pixelBounds).set == true) {
    (pIVar9->pixelBounds).set = false;
  }
  TVar6 = (pRVar8->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)&(pIVar9->pixelBounds).optionalValue =
       (this_00->pMin).super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)((long)&(pIVar9->pixelBounds).optionalValue + 8) = TVar6;
  (pIVar9->pixelBounds).set = true;
  if ((pIVar9->fullResolution).set == true) {
    (pIVar9->fullResolution).set = false;
  }
  (pIVar9->fullResolution).optionalValue =
       *(aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
        &(pRVar8->super_FilmBase).fullResolution.super_Tuple2<pbrt::Point2,_int>;
  (pIVar9->fullResolution).set = true;
  if ((pIVar9->colorSpace).set == true) {
    (pIVar9->colorSpace).set = false;
  }
  (pIVar9->colorSpace).optionalValue =
       (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
       )pRVar8->colorSpace;
  (pIVar9->colorSpace).set = true;
  return pIVar7;
}

Assistant:

Image RGBFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()), {"R", "G", "B"});

    ParallelFor2D(pixelBounds, [&](Point2i p) {
        RGB rgb = GetPixelRGB(p, splatScale);

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, {rgb[0], rgb[1], rgb[2]});
    });

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}